

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O0

int AF_AActor_A_MissileAttack
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  PClassActor *MissileType_00;
  PClassActor *self_00;
  MetaClass *pMVar1;
  bool bVar2;
  bool local_4b;
  FSoundID local_48;
  FName local_44;
  PClassActor *local_40;
  PClassActor *MissileType;
  AActor *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  TArray<VMValue,_VMValue> *pTStack_18;
  int numparam_local;
  TArray<VMValue,_VMValue> *defaultparam_local;
  VMValue *param_local;
  
  self._0_4_ = 0;
  self._4_4_ = numret;
  _paramnum = ret;
  ret_local._4_4_ = numparam;
  pTStack_18 = defaultparam;
  defaultparam_local = (TArray<VMValue,_VMValue> *)param;
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x3cb,
                  "int AF_AActor_A_MissileAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  bVar2 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar2 = true, (param->field_0).field_1.atag != 1)) {
    bVar2 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (bVar2) {
    MissileType = (PClassActor *)(param->field_0).field_1.a;
    local_4b = true;
    if (MissileType != (PClassActor *)0x0) {
      local_4b = DObject::IsKindOf((DObject *)MissileType,AActor::RegistrationInfo.MyClass);
    }
    if (local_4b != false) {
      pMVar1 = AActor::GetClass((AActor *)MissileType);
      FName::FName(&local_44,&pMVar1->MissileName);
      local_40 = PClass::FindActor(&local_44);
      self_00 = MissileType;
      FSoundID::FSoundID(&local_48,0);
      MissileType_00 = local_40;
      pMVar1 = AActor::GetClass((AActor *)MissileType);
      DoAttack((AActor *)self_00,false,true,0,&local_48,MissileType_00,pMVar1->MissileHeight);
      return 0;
    }
    __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x3cb,
                  "int AF_AActor_A_MissileAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                ,0x3cb,
                "int AF_AActor_A_MissileAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)")
  ;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_MissileAttack)
{
	PARAM_SELF_PROLOGUE(AActor);
	PClassActor *MissileType = PClass::FindActor(self->GetClass()->MissileName);
	DoAttack(self, false, true, 0, 0, MissileType, self->GetClass()->MissileHeight);
	return 0;
}